

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTestsNamesOnly(Config *config)

{
  size_type sVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar4;
  undefined4 extraout_var_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar5;
  pointer pTVar6;
  size_t sVar7;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  char local_49;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_48;
  
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  pSVar4 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar3 = (*(pSVar4->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar4);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
                        ((long *)CONCAT44(extraout_var_00,iVar3),config);
  filterTests(&local_48,testCases,(TestSpec *)CONCAT44(extraout_var,iVar2),&config->super_IConfig);
  sVar7 = 0;
  if (local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar6 = local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      sVar1 = (pTVar6->super_TestCaseInfo).name._M_string_length;
      if ((sVar1 == 0) || (*(pTVar6->super_TestCaseInfo).name._M_dataplus._M_p != '#')) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(pTVar6->super_TestCaseInfo).name._M_dataplus._M_p,sVar1);
      }
      else {
        local_49 = '\"';
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_49,1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pTVar6->super_TestCaseInfo).name._M_dataplus._M_p,
                            (pTVar6->super_TestCaseInfo).name._M_string_length);
        local_49 = '\"';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_49,1);
      }
      iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])(config);
      if (1 < iVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t@",2);
        operator<<((ostream *)&std::cout,&(pTVar6->super_TestCaseInfo).lineInfo);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      pTVar6 = pTVar6 + 1;
      sVar7 = sVar7 + 1;
    } while (pTVar6 != local_48.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_48);
  return sVar7;
}

Assistant:

std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            matchedTests++;
            if( startsWith( testCaseInfo.name, '#' ) )
               Catch::cout() << '"' << testCaseInfo.name << '"';
            else
               Catch::cout() << testCaseInfo.name;
            if ( config.verbosity() >= Verbosity::High )
                Catch::cout() << "\t@" << testCaseInfo.lineInfo;
            Catch::cout() << std::endl;
        }
        return matchedTests;
    }